

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

bool __thiscall
command_tester::inside<17ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
          (command_tester *this,array<TypeCommand,_17UL> *command_list1,
          vector<TypeCommand,_std::allocator<TypeCommand>_> *command_list2)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  const_iterator __first_00;
  const_iterator __last_00;
  undefined1 local_41;
  vector<TypeCommand,_std::allocator<TypeCommand>_> *command_list2_local;
  array<TypeCommand,_17UL> *command_list1_local;
  command_tester *this_local;
  
  __first = std::array<TypeCommand,_17UL>::begin(command_list1);
  __last = std::array<TypeCommand,_17UL>::end(command_list1);
  bVar1 = std::
          any_of<TypeCommand_const*,command_tester::inside<17ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>(std::array<TypeCommand,17ul>const&,std::vector<TypeCommand,std::allocator<TypeCommand>>const&)::_lambda(TypeCommand)_1_>
                    (__first,__last,(anon_class_8_1_8991fb9c_for__M_pred)this);
  local_41 = true;
  if (!bVar1) {
    __first_00 = std::vector<TypeCommand,_std::allocator<TypeCommand>_>::begin(command_list2);
    __last_00 = std::vector<TypeCommand,_std::allocator<TypeCommand>_>::end(command_list2);
    local_41 = std::
               any_of<__gnu_cxx::__normal_iterator<TypeCommand_const*,std::vector<TypeCommand,std::allocator<TypeCommand>>>,command_tester::inside<17ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>(std::array<TypeCommand,17ul>const&,std::vector<TypeCommand,std::allocator<TypeCommand>>const&)::_lambda(TypeCommand)_2_>
                         ((__normal_iterator<const_TypeCommand_*,_std::vector<TypeCommand,_std::allocator<TypeCommand>_>_>
                           )__first_00._M_current,
                          (__normal_iterator<const_TypeCommand_*,_std::vector<TypeCommand,_std::allocator<TypeCommand>_>_>
                           )__last_00._M_current,(anon_class_8_1_8991fb9c_for__M_pred)this);
  }
  return local_41;
}

Assistant:

bool inside(std::array<TypeCommand, inum> const &command_list1, vec2_t const &command_list2 = {}){
        return (std::any_of(command_list1.begin(), command_list1.end(), [&](TypeCommand c)->bool{ return (c == command); })
            or std::any_of(command_list2.begin(), command_list2.end(), [&](TypeCommand c)->bool{ return (c == command); }));
    }